

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::Unlink(PF_BufferMgr *this,int slot)

{
  int iVar1;
  int iVar2;
  PF_BufPageDesc *pPVar3;
  
  pPVar3 = this->bufTable;
  if (this->first == slot) {
    this->first = pPVar3[slot].next;
  }
  if (this->last == slot) {
    this->last = pPVar3[slot].prev;
  }
  iVar1 = pPVar3[slot].next;
  iVar2 = pPVar3[slot].prev;
  if ((long)iVar1 != -1) {
    pPVar3[iVar1].prev = iVar2;
  }
  if (iVar2 != -1) {
    pPVar3[iVar2].next = iVar1;
  }
  pPVar3[slot].next = -1;
  pPVar3[slot].prev = -1;
  return 0;
}

Assistant:

RC PF_BufferMgr::Unlink(int slot)
{
   // If slot is at head of list, set first to next element
   if (first == slot)
      first = bufTable[slot].next;

   // If slot is at end of list, set last to previous element
   if (last == slot)
      last = bufTable[slot].prev;

   // If slot not at end of list, point next back to previous
   if (bufTable[slot].next != INVALID_SLOT)
      bufTable[bufTable[slot].next].prev = bufTable[slot].prev;

   // If slot not at head of list, point prev forward to next
   if (bufTable[slot].prev != INVALID_SLOT)
      bufTable[bufTable[slot].prev].next = bufTable[slot].next;

   // Set next and prev pointers of slot entry
   bufTable[slot].prev = bufTable[slot].next = INVALID_SLOT;

   // Return ok
   return (0);
}